

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O2

void Bmc_MnaBuild(Gia_Man_t *p,Vec_Int_t *vCos,Vec_Int_t *vNodes,Gia_Man_t *pNew,Vec_Int_t *vMap,
                 Vec_Int_t *vPiMap)

{
  int iVar1;
  uint uVar2;
  int i;
  Gia_Obj_t *pGVar3;
  int iVar4;
  
  for (iVar4 = 0; iVar4 < vCos->nSize; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(vCos,iVar4);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if ((-1 < (int)(uint)*(undefined8 *)pGVar3) ||
       (uVar2 = (uint)*(undefined8 *)pGVar3 & 0x1fffffff, uVar2 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsCo(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcBmcAnd.c"
                    ,0x106,
                    "void Bmc_MnaBuild(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    Bmc_MnaBuild_rec(p,pGVar3 + -(ulong)uVar2,pNew,vMap,vPiMap);
    iVar1 = Gia_ObjFaninId0p(p,pGVar3);
    iVar1 = Vec_IntEntry(vMap,iVar1);
    iVar1 = Abc_LitNotCond(iVar1,*(uint *)pGVar3 >> 0x1d & 1);
    i = Gia_ObjId(p,pGVar3);
    Vec_IntWriteEntry(vMap,i,iVar1);
  }
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0x7fffffffffffffff;
  iVar4 = 0;
  while( true ) {
    if (vNodes->nSize <= iVar4) {
      return;
    }
    iVar1 = Vec_IntEntry(vNodes,iVar4);
    pGVar3 = Gia_ManObj(p,iVar1);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0x7fffffffffffffff;
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void Bmc_MnaBuild( Gia_Man_t * p, Vec_Int_t * vCos, Vec_Int_t * vNodes, Gia_Man_t * pNew, Vec_Int_t * vMap, Vec_Int_t * vPiMap )
{
    Gia_Obj_t * pObj;
    int i, iLit;
    Gia_ManForEachObjVec( vCos, p, pObj, i )
    {
        assert( Gia_ObjIsCo(pObj) );
        Bmc_MnaBuild_rec( p, Gia_ObjFanin0(pObj), pNew, vMap, vPiMap );
        iLit = Abc_LitNotCond( Vec_IntEntry(vMap, Gia_ObjFaninId0p(p, pObj)), Gia_ObjFaninC0(pObj) );
        Vec_IntWriteEntry( vMap, Gia_ObjId(p, pObj), iLit );
    }
    Gia_ManConst0(p)->fPhase = 0;
    Gia_ManForEachObjVec( vNodes, p, pObj, i )
        pObj->fPhase = 0;
}